

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

CZString * __thiscall Json::Value::CZString::operator=(CZString *this,CZString *other)

{
  anon_union_4_2_4572b0f8_for_CZString_1 aVar1;
  char *pcVar2;
  
  pcVar2 = this->cstr_;
  this->cstr_ = other->cstr_;
  other->cstr_ = pcVar2;
  aVar1 = this->field_1;
  this->field_1 = other->field_1;
  other->field_1 = aVar1;
  return this;
}

Assistant:

Value::CZString& Value::CZString::operator=(CZString other) {
  swap(other);
  return *this;
}